

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandLineArgument.h
# Opt level: O2

void __thiscall
cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*,cmMakefile*)>::
cmCommandLineArgument<std::function<bool(std::__cxx11::string_const&,cmake*,cmMakefile*)>>
          (cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*,cmMakefile*)> *this,
          string *n,Values t,
          function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*,_cmMakefile_*)>
          *func)

{
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  local_60.View_._M_len = 0x17;
  local_60.View_._M_str = " is invalid syntax for ";
  local_90.View_._M_str = (n->_M_dataplus)._M_p;
  local_90.View_._M_len = n->_M_string_length;
  cmStrCat<>((string *)this,&local_60,&local_90);
  local_60.View_._M_len = 0x18;
  local_60.View_._M_str = "Invalid value used with ";
  local_90.View_._M_str = (n->_M_dataplus)._M_p;
  local_90.View_._M_len = n->_M_string_length;
  cmStrCat<>((string *)(this + 0x20),&local_60,&local_90);
  std::__cxx11::string::string((string *)(this + 0x40),(string *)n);
  *(Values *)(this + 0x60) = t;
  *(undefined4 *)(this + 100) = 0;
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*,_cmMakefile_*)>
  ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*,_cmMakefile_*)>
              *)(this + 0x68),func);
  return;
}

Assistant:

cmCommandLineArgument(std::string n, Values t, FunctionType&& func)
    : InvalidSyntaxMessage(cmStrCat(" is invalid syntax for ", n))
    , InvalidValueMessage(cmStrCat("Invalid value used with ", n))
    , Name(std::move(n))
    , Type(t)
    , SeparatorNeeded(RequiresSeparator::Yes)
    , StoreCall(std::forward<FunctionType>(func))
  {
  }